

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString * __thiscall
SimpleStringCollection::operator[](SimpleStringCollection *this,size_t index)

{
  SimpleString *this_00;
  SimpleString local_28;
  
  if (index < this->size_) {
    this_00 = this->collection_ + index;
  }
  else {
    local_28.buffer_ = (char *)0x0;
    local_28.bufferSize_ = 0;
    SimpleString::copyBufferToNewInternalBuffer(&local_28,"");
    this_00 = &this->empty_;
    SimpleString::copyBufferToNewInternalBuffer(this_00,&local_28);
    SimpleString::deallocateInternalBuffer(&local_28);
  }
  return this_00;
}

Assistant:

SimpleString& SimpleStringCollection::operator[](size_t index)
{
    if (index >= size_) {
        empty_ = "";
        return empty_;
    }

    return collection_[index];
}